

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O3

uint32_t __thiscall
ddd::DaTrie<true,_false,_true>::xcheck_in_block_
          (DaTrie<true,_false,_true> *this,Edge *edge,uint32_t block_pos,
          vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *blocks)

{
  uint32_t uVar1;
  pointer pBVar2;
  ulong uVar3;
  pointer pBVar4;
  ulong uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  
  pBVar2 = (blocks->super__Vector_base<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = edge->size_;
  uVar7 = 0xffffffff;
  if (uVar3 <= pBVar2[block_pos].num_emps) {
    uVar1 = pBVar2[block_pos].head;
    pBVar4 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = uVar1;
    while (uVar7 = uVar6 ^ edge->labels_[0], uVar3 != 0) {
      uVar5 = 0;
      while (-1 < (long)pBVar4[edge->labels_[uVar5] ^ uVar7]) {
        uVar5 = uVar5 + 1;
        if (uVar3 == uVar5) {
          return uVar7;
        }
      }
      uVar6 = *(uint *)(pBVar4 + uVar6) & 0x7fffffff;
      if (uVar6 == uVar1) {
        return 0xffffffff;
      }
    }
  }
  return uVar7;
}

Assistant:

uint32_t xcheck_in_block_(const Edge& edge, uint32_t block_pos,
                            const std::vector<BlockLink>& blocks) const {
    assert(0 < edge.size());

    if (blocks[block_pos].num_emps < edge.size()) {
      return NOT_FOUND;
    }

    auto head = blocks[block_pos].head;
    auto node_pos = head;

    do {
      auto base = node_pos ^*edge.begin();
      if (is_target_(base, edge)) {
        return base;
      }
    } while ((node_pos = next_(node_pos)) != head);

    return NOT_FOUND;
  }